

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O3

RealType __thiscall OpenMD::Thermo::getTotalEnergy(Thermo *this)

{
  Snapshot *this_00;
  RealType RVar1;
  RealType RVar2;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasTotalEnergy == false) {
    RVar1 = getKinetic(this);
    RVar2 = Snapshot::getPotentialEnergy(this->info_->sman_->currentSnapshot_);
    Snapshot::setTotalEnergy(this_00,RVar2 + RVar1);
  }
  RVar1 = Snapshot::getTotalEnergy(this_00);
  return RVar1;
}

Assistant:

RealType Thermo::getTotalEnergy() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasTotalEnergy) {
      snap->setTotalEnergy(this->getKinetic() + this->getPotential());
    }

    return snap->getTotalEnergy();
  }